

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

double __thiscall dynamicgraph::command::Value::doubleValue(Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c [3];
  double result;
  Value *this_local;
  
  if (this->type_ != DOUBLE) {
    result = (double)this;
    this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
    local_1c[0] = 700;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"value is not a double",&local_41);
    ExceptionAbstract::ExceptionAbstract(this_00,local_1c,&local_40);
    __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
  }
  return *this->value_;
}

Assistant:

double Value::doubleValue() const {
  double result;
  if (DOUBLE != type_)
    throw ExceptionAbstract(ExceptionAbstract::TOOLS, "value is not a double");
  result = *((const double *)value_);
  return result;
}